

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void kinlist(Symbol *fun,Rlist *rlst)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  int dim_1;
  int dim;
  Item *qv;
  Symbol *s;
  int count;
  int i;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Item *in_stack_ffffffffffffffd8;
  Symbol *s_00;
  int local_14;
  
  if (*(int *)(in_RSI + 0x48) == 0) {
    *(undefined4 *)(in_RSI + 0x48) = 1;
    for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x30); local_14 = local_14 + 1) {
      lVar1 = *(long *)(*(long *)(in_RSI + 0x20) + (long)local_14 * 8);
      if ((*(ulong *)(lVar1 + 8) & 0x20) != 0) {
        in_stack_ffffffffffffffd4 = *(undefined4 *)(lVar1 + 0x38);
      }
    }
    for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x30); local_14 = local_14 + 1) {
      s_00 = *(Symbol **)(*(long *)(in_RSI + 0x20) + (long)local_14 * 8);
      slist_data(s_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8
                );
      if ((s_00->subtype & 0x20U) == 0) {
        sprintf(buf,"_slist%d[%d] = &(%s) - _p;",(ulong)*(uint *)(in_RDI + 0x28),
                (ulong)(uint)s_00->varnum,s_00->name);
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        sprintf(buf," _dlist%d[%d] = &(D%s) - _p;\n",(ulong)*(uint *)(in_RDI + 0x28),
                (ulong)(uint)s_00->varnum,s_00->name);
        in_stack_ffffffffffffffd8 =
             lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
      }
      else {
        in_stack_ffffffffffffffd0 = s_00->araydim;
        sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;",
                (ulong)in_stack_ffffffffffffffd0,(ulong)*(uint *)(in_RDI + 0x28),
                (ulong)(uint)s_00->varnum,s_00->name);
        lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        sprintf(buf," _dlist%d[%d+_i] = (D%s + _i) - _p;}\n",(ulong)*(uint *)(in_RDI + 0x28),
                (ulong)(uint)s_00->varnum,s_00->name);
        in_stack_ffffffffffffffd8 =
             lappendstr((List *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
      }
      s_00->used = 0;
    }
  }
  return;
}

Assistant:

static void kinlist(fun, rlst)
	Symbol *fun;
	Rlist *rlst;
{
	int i, count;
	Symbol *s;
	Item* qv;
	
	if (rlst->slist_decl) {
		return;
	}
	rlst->slist_decl = 1;
	/* put slist and dlist in initlist */

	count = 0;
	for (i=0; i < rlst->nsym; i++) {
		s = rlst->symorder[i];
		if (s->subtype & ARRAY) { int dim = s->araydim;
			count += dim;
		}else{
			count++;
		}
	}
	for (i=0; i < rlst->nsym; i++) {
		s = rlst->symorder[i];
#if CVODE
		slist_data(s, s->varnum, fun->u.i);
#endif
if (s->subtype & ARRAY) { int dim = s->araydim;
	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;"
		,dim, fun->u.i , s->varnum, s->name);
	qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p[_ix];"
		,dim, fun->u.i , s->varnum, s->name);
	vectorize_substitute(qv, buf);
}
#endif
	Sprintf(buf, " _dlist%d[%d+_i] = (D%s + _i) - _p;}\n"
		, fun->u.i, s->varnum, s->name);
	qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
	Sprintf(buf, " _dlist%d[%d+_i] = (D%s + _i) - _p[_ix];}\n"
		, fun->u.i, s->varnum, s->name);
	vectorize_substitute(qv, buf);
}
#endif
}else{
		Sprintf(buf, "_slist%d[%d] = &(%s) - _p;",
			fun->u.i, s->varnum, s->name);
		qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
		Sprintf(buf, "_slist%d[%d] = &(%s) - _p[_ix];",
			fun->u.i, s->varnum, s->name);
		vectorize_substitute(qv, buf);
}
#endif
		Sprintf(buf, " _dlist%d[%d] = &(D%s) - _p;\n",
			fun->u.i, s->varnum, s->name);
		qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
		Sprintf(buf, " _dlist%d[%d] = &(D%s) - _p[_ix];\n",
			fun->u.i, s->varnum, s->name);
		vectorize_substitute(qv, buf);
}
#endif
}
		s->used = 0;
	}
}